

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

size_t intersect_accel<false,false,true>(Ray *ray,Accel *accel,TraversalStats *stats)

{
  pointer pNVar1;
  Vec<float,_3UL> *pVVar2;
  float fVar3;
  Index IVar4;
  pointer pNVar5;
  pointer pPVar6;
  size_t sVar7;
  float fVar8;
  ulong uVar9;
  undefined8 uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Index IVar21;
  Index IVar22;
  size_t i;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float t1;
  float local_204;
  uint local_200;
  float local_1fc;
  undefined1 local_1f8 [12];
  undefined1 auStack_1ec [4];
  Vec<float,_3UL> v;
  undefined1 local_1c8 [8];
  Vec<float,_3UL> *local_1c0;
  float *local_1b8;
  Vec<float,_3UL> *local_1b0;
  pointer local_1a8;
  Accel *local_1a0;
  Vec<float,_3UL> local_198;
  size_t local_188;
  TraversalStats *local_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  Vec<float,_3UL> *local_148;
  size_t local_140;
  Index<32UL,_4UL> local_138;
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> stack;
  
  auVar36._8_4_ = 0x7f7fffff;
  auVar36._0_8_ = 0x7f7fffff7f7fffff;
  auVar36._12_4_ = 0x7f7fffff;
  auVar32._8_4_ = 0x7fffffff;
  auVar32._0_8_ = 0x7fffffff7fffffff;
  auVar32._12_4_ = 0x7fffffff;
  auVar35._8_4_ = 0x80000000;
  auVar35._0_8_ = 0x8000000080000000;
  auVar35._12_4_ = 0x80000000;
  local_148 = &ray->dir;
  stack.size = 0;
  fVar27 = (ray->dir).values[2];
  local_138.value =
       (((accel->bvh).nodes.
         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->index).value;
  auVar26 = vpand_avx(ZEXT416((uint)fVar27),auVar32);
  auVar24 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)fVar27),auVar35,0xf8);
  uVar10 = vcmpss_avx512f(auVar26,ZEXT416(0x34000000),6);
  bVar11 = (bool)((byte)uVar10 & 1);
  uVar23 = *(ulong *)(ray->dir).values;
  uVar10 = *(undefined8 *)(ray->org).values;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar23;
  auVar26 = vpand_avx(auVar37,auVar32);
  auVar25._8_4_ = 0x7fffffff;
  auVar25._0_8_ = 0x7fffffff7fffffff;
  auVar25._12_4_ = 0x7fffffff;
  auVar25 = vpternlogd_avx512vl(auVar36,auVar37,auVar25,0xe4);
  local_168._4_12_ = auVar24._4_12_;
  local_168._0_4_ = (float)((uint)bVar11 * (int)(1.0 / fVar27) + (uint)!bVar11 * auVar24._0_4_);
  auVar24._8_4_ = 0x34000000;
  auVar24._0_8_ = 0x3400000034000000;
  auVar24._12_4_ = 0x34000000;
  uVar9 = vcmpps_avx512vl(auVar26,auVar24,6);
  auVar26._8_4_ = 0x3f800000;
  auVar26._0_8_ = 0x3f8000003f800000;
  auVar26._12_4_ = 0x3f800000;
  local_204 = -local_168._0_4_ * (ray->org).values[2];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar23;
  auVar26 = vdivps_avx512vl(auVar26,auVar38);
  bVar11 = (bool)((byte)uVar9 & 1);
  local_158 = (float)((uint)bVar11 * auVar26._0_4_ | (uint)!bVar11 * auVar25._0_4_);
  bVar11 = (bool)((byte)(uVar9 >> 1) & 1);
  fStack_154 = (float)((uint)bVar11 * auVar26._4_4_ | (uint)!bVar11 * auVar25._4_4_);
  bVar11 = (bool)((byte)(uVar9 >> 2) & 1);
  fStack_150 = (float)((uint)bVar11 * auVar26._8_4_ | (uint)!bVar11 * auVar25._8_4_);
  bVar11 = (bool)((byte)(uVar9 >> 3) & 1);
  fStack_14c = (float)((uint)bVar11 * auVar26._12_4_ | (uint)!bVar11 * auVar25._12_4_);
  local_178 = (float)uVar10 * -local_158;
  fStack_174 = (float)((ulong)uVar10 >> 0x20) * -fStack_154;
  fStack_170 = -fStack_150 * 0.0;
  fStack_16c = -fStack_14c * 0.0;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)((ray->dir).values + 1);
  auVar26 = vpsrlvd_avx2(auVar33,_DAT_001170f0);
  auVar12._8_4_ = 2;
  auVar12._0_8_ = 0x400000002;
  auVar12._12_4_ = 4;
  auVar26 = vpandq_avx512vl(auVar26,auVar12);
  local_200 = auVar26._4_4_ | auVar26._0_4_ | (uint)uVar23 >> 0x1f;
  local_180 = stats;
  bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::push(&stack,&local_138);
  local_188 = 0xffffffffffffffff;
  local_1a0 = accel;
LAB_0010557c:
  do {
    if (stack.size == 0) {
      return local_188;
    }
    IVar22.value = (Type)bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::pop(&stack);
    while( true ) {
      uVar23 = (ulong)(IVar22.value >> 4);
      if ((IVar22.value & 0xf) != 0) break;
      pNVar5 = (accel->bvh).nodes.
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar17._4_4_ = fStack_154;
      auVar17._0_4_ = local_158;
      auVar17._8_4_ = fStack_150;
      auVar17._12_4_ = fStack_14c;
      local_1c8 = (undefined1  [8])&v;
      unique0x00004e80 = &local_200;
      pNVar1 = pNVar5 + uVar23;
      local_180->visited_nodes = local_180->visited_nodes + 1;
      auVar26 = vinsertps_avx(ZEXT416(*(uint *)((long)&pNVar1->bounds + (ulong)(local_200 & 1) * 4))
                              ,ZEXT416(*(uint *)((long)&pNVar1->bounds +
                                                (ulong)(local_200 * 2 & 4) + 8)),0x10);
      auVar25 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)&pNVar1->bounds +
                                                 (ulong)(local_200 & 4) + 0x10)),local_168,
                                ZEXT416((uint)local_204));
      auVar13._4_4_ = fStack_174;
      auVar13._0_4_ = local_178;
      auVar13._8_4_ = fStack_170;
      auVar13._12_4_ = fStack_16c;
      auVar26 = vfmadd213ps_fma(auVar26,auVar17,auVar13);
      local_198.values._0_8_ = vmovlps_avx(auVar26);
      local_198.values[2] = auVar25._0_4_;
      local_1f8._0_8_ = pNVar1;
      local_1c0 = (Vec<float,_3UL> *)local_1f8;
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1c8,0);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1c8,1);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1c8,2);
      auVar29._4_4_ = v.values[1];
      auVar29._0_4_ = v.values[0];
      auVar29._8_8_ = 0;
      auVar18._4_4_ = fStack_154;
      auVar18._0_4_ = local_158;
      auVar18._8_4_ = fStack_150;
      auVar18._12_4_ = fStack_14c;
      local_1c0 = &local_198;
      auVar14._4_4_ = fStack_174;
      auVar14._0_4_ = local_178;
      auVar14._8_4_ = fStack_170;
      auVar14._12_4_ = fStack_16c;
      auVar26 = vfmadd213ps_fma(auVar29,auVar18,auVar14);
      auVar25 = vfmadd213ss_fma(ZEXT416((uint)v.values[2]),local_168,ZEXT416((uint)local_204));
      local_1f8._0_8_ = vmovlps_avx(auVar26);
      stack0xfffffffffffffe10 = (uint *)CONCAT44(auStack_1ec,auVar25._0_4_);
      v.values[0] = ray->tmin;
      t1 = ray->tmax;
      local_1c8 = (undefined1  [8])&v;
      local_1b8 = &t1;
      local_1b0 = (Vec<float,_3UL> *)local_1f8;
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1c8,0);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1c8,1);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1c8,2);
      auVar19._4_4_ = fStack_154;
      auVar19._0_4_ = local_158;
      auVar19._8_4_ = fStack_150;
      auVar19._12_4_ = fStack_14c;
      auVar25 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)(pNVar1 + 1) + 0x10U +
                                                 (ulong)(local_200 & 4))),local_168,
                                ZEXT416((uint)local_204));
      local_1a8 = (pointer)CONCAT44(local_1a8._4_4_,v.values[0]);
      local_1fc = t1;
      auVar26 = vinsertps_avx(ZEXT416(*(uint *)((long)(pNVar1 + 1) + (ulong)(local_200 & 1) * 4)),
                              ZEXT416(*(uint *)((long)(pNVar1 + 1) + 8U + (ulong)(local_200 * 2 & 4)
                                               )),0x10);
      unique0x00004e80 = &local_200;
      auVar15._4_4_ = fStack_174;
      auVar15._0_4_ = local_178;
      auVar15._8_4_ = fStack_170;
      auVar15._12_4_ = fStack_16c;
      auVar26 = vfmadd213ps_fma(auVar26,auVar19,auVar15);
      local_198.values._0_8_ = vmovlps_avx(auVar26);
      local_198.values[2] = auVar25._0_4_;
      local_1f8._0_8_ = pNVar5 + uVar23 + 1;
      local_1c8 = (undefined1  [8])&v;
      local_1c0 = (Vec<float,_3UL> *)local_1f8;
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1c8,0);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1c8,1);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1c8,2);
      auVar30._4_4_ = v.values[1];
      auVar30._0_4_ = v.values[0];
      auVar30._8_8_ = 0;
      auVar20._4_4_ = fStack_154;
      auVar20._0_4_ = local_158;
      auVar20._8_4_ = fStack_150;
      auVar20._12_4_ = fStack_14c;
      local_1c0 = &local_198;
      auVar16._4_4_ = fStack_174;
      auVar16._0_4_ = local_178;
      auVar16._8_4_ = fStack_170;
      auVar16._12_4_ = fStack_16c;
      auVar26 = vfmadd213ps_fma(auVar30,auVar20,auVar16);
      auVar25 = vfmadd213ss_fma(ZEXT416((uint)v.values[2]),local_168,ZEXT416((uint)local_204));
      local_1f8._0_8_ = vmovlps_avx(auVar26);
      stack0xfffffffffffffe10 = (uint *)CONCAT44(auStack_1ec,auVar25._0_4_);
      v.values[0] = ray->tmin;
      t1 = ray->tmax;
      local_1c8 = (undefined1  [8])&v;
      local_1b8 = &t1;
      local_1b0 = (Vec<float,_3UL> *)local_1f8;
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1c8,0);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1c8,1);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1c8,2);
      accel = local_1a0;
      if (local_1a8._0_4_ <= local_1fc) {
        IVar22.value = (pNVar1->index).value;
        if (v.values[0] <= t1) {
          IVar4.value = ((Index *)((long)(pNVar1 + 1) + 0x18))->value;
          IVar21.value = IVar22.value;
          if (v.values[0] < local_1a8._0_4_) {
            IVar21.value = IVar4.value;
            IVar4.value = IVar22.value;
          }
          IVar22.value = IVar21.value;
          local_1c8._0_4_ = IVar4.value;
          bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::push
                    (&stack,(Index<32UL,_4UL> *)local_1c8);
        }
      }
      else {
        if (t1 < v.values[0]) goto LAB_0010557c;
        IVar22.value = ((Index *)((long)(pNVar1 + 1) + 0x18))->value;
      }
    }
    local_180->visited_leaves = local_180->visited_leaves + 1;
    for (; uVar23 < (IVar22.value & 0xf) + (IVar22.value >> 4); uVar23 = uVar23 + 1) {
      pPVar6 = (accel->tris).
               super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar7 = (accel->bvh).prim_ids.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar23];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)(ray->org).values;
      pVVar2 = &pPVar6[sVar7].n;
      local_1a8 = pPVar6 + sVar7 + 1;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(((PrecomputedTri<float> *)(pVVar2 + -3))->p0).values;
      auVar25 = vsubps_avx(auVar31,auVar34);
      fVar8 = (((PrecomputedTri<float> *)(pVVar2 + -3))->p0).values[2] - (ray->org).values[2];
      local_1c8 = (undefined1  [8])vmovlps_avx(auVar25);
      auVar26 = vmovshdup_avx(auVar25);
      local_1c0 = (Vec<float,_3UL> *)CONCAT44(local_1c0._4_4_,fVar8);
      fVar27 = (ray->dir).values[2];
      fVar28 = (ray->dir).values[0];
      fVar3 = (ray->dir).values[1];
      auVar24 = vfmsub231ss_fma(ZEXT416((uint)(auVar26._0_4_ * fVar27)),ZEXT416((uint)fVar3),
                                ZEXT416((uint)fVar8));
      auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar8 * fVar28)),auVar25,ZEXT416((uint)fVar27));
      auVar25 = vfmsub231ss_fma(ZEXT416((uint)(auVar25._0_4_ * fVar3)),ZEXT416((uint)fVar28),auVar26
                               );
      auVar26 = vinsertps_avx(auVar24,auVar12,0x10);
      local_1f8._0_8_ = vmovlps_avx(auVar26);
      stack0xfffffffffffffe10 = (uint *)CONCAT44(auStack_1ec,auVar25._0_4_);
      local_140 = sVar7;
      fVar27 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,pVVar2,local_1a8,local_148);
      fVar27 = 1.0 / fVar27;
      local_1fc = std::
                  transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                            (0,local_1f8,auStack_1ec,&pPVar6[sVar7].e2);
      local_1fc = local_1fc * fVar27;
      fVar28 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,local_1f8,auStack_1ec,&pPVar6[sVar7].e1);
      if (((-1.1920929e-07 <= local_1fc) && (-1.1920929e-07 <= fVar27 * fVar28)) &&
         (-1.1920929e-07 <= (1.0 - local_1fc) - fVar27 * fVar28)) {
        fVar28 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,pVVar2,local_1a8,local_1c8);
        fVar28 = fVar28 * fVar27;
        if ((ray->tmin <= fVar28) && (fVar28 <= ray->tmax)) {
          ray->tmax = fVar28;
          local_188 = local_140;
        }
      }
      accel = local_1a0;
    }
  } while( true );
}

Assistant:

static size_t intersect_accel(Ray& ray, const Accel& accel, TraversalStats& stats) {
    size_t prim_id = invalid_id;
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    accel.bvh.intersect<false, UseRobustTraversal>(ray, accel.bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            if constexpr (CaptureStats)
                stats.visited_leaves++;
            for (size_t i = begin; i < end; ++i) {
                size_t j = PermutePrims ? i : accel.bvh.prim_ids[i];
                if (auto hit = accel.tris[j].intersect(ray)) {
                    ray.tmax = std::get<0>(*hit);
                    prim_id = j;
                }
            }
            return prim_id != invalid_id;
        },
        [&] (auto&&, auto&&) {
            if constexpr (CaptureStats)
                stats.visited_nodes++;
        });
    return prim_id;
}